

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

string * writeCSVFile(string *envName,string *defaultFile,string *dumpDir,string *defaultDir,
                     int index)

{
  undefined4 in_register_00000084;
  string asStack_a8 [32];
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)defaultFile);
  std::__cxx11::string::string((string *)&local_68,(string *)dumpDir);
  std::__cxx11::string::string((string *)&local_88,(string *)defaultDir);
  std::__cxx11::string::string(asStack_a8,(string *)CONCAT44(in_register_00000084,index));
  writeFile(envName,&local_48,&local_68,&local_88,(int)asStack_a8);
  std::__cxx11::string::~string(asStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return envName;
}

Assistant:

ofstream writeCSVFile(string envName, string defaultFile,string dumpDir,string defaultDir, int index){
    return writeFile(envName, defaultFile, dumpDir, defaultDir, index);
}